

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerGLSL::expression_is_non_value_type_array(CompilerGLSL *this,uint32_t ptr)

{
  bool bVar1;
  SPIRType *pSVar2;
  SPIRVariable *pSVar3;
  
  pSVar2 = Compiler::expression_type(&this->super_Compiler,ptr);
  if ((pSVar2->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    if ((this->backend).array_is_value_type != true) {
      return true;
    }
    pSVar3 = Compiler::maybe_get_backing_variable(&this->super_Compiler,ptr);
    if (pSVar3 != (SPIRVariable *)0x0) {
      pSVar2 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)&(pSVar3->super_IVariant).field_0xc);
      if ((this->backend).buffer_offset_array_is_value_type != false) {
        return false;
      }
      if (*(int *)&(pSVar2->super_IVariant).field_0xc != 0xf) {
        return false;
      }
      bVar1 = Compiler::has_member_decoration
                        (&this->super_Compiler,(TypeID)(pSVar2->super_IVariant).self.id,0,
                         DecorationOffset);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool CompilerGLSL::expression_is_non_value_type_array(uint32_t ptr)
{
	auto &type = expression_type(ptr);
	if (type.array.empty())
		return false;

	if (!backend.array_is_value_type)
		return true;

	auto *var = maybe_get_backing_variable(ptr);
	if (!var)
		return false;

	auto &backed_type = get<SPIRType>(var->basetype);
	return !backend.buffer_offset_array_is_value_type && backed_type.basetype == SPIRType::Struct &&
	       has_member_decoration(backed_type.self, 0, DecorationOffset);
}